

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_table_size(nghttp2_bufs *bufs,size_t table_size)

{
  uint8_t local_48 [8];
  uint8_t sb [16];
  size_t blocklen;
  uint8_t *bufp;
  int rv;
  size_t table_size_local;
  nghttp2_bufs *bufs_local;
  
  sb._8_8_ = count_encoded_length(table_size,5);
  if ((ulong)sb._8_8_ < 0x11) {
    local_48[0] = ' ';
    encode_length(local_48,table_size,5);
    bufs_local._4_4_ = nghttp2_bufs_add(bufs,local_48,sb._8_8_);
    if (bufs_local._4_4_ == 0) {
      bufs_local._4_4_ = 0;
    }
  }
  else {
    bufs_local._4_4_ = -0x20b;
  }
  return bufs_local._4_4_;
}

Assistant:

static int emit_table_size(nghttp2_bufs *bufs, size_t table_size) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];

  DEBUGF("deflatehd: emit table_size=%zu\n", table_size);

  blocklen = count_encoded_length(table_size, 5);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = 0x20u;

  encode_length(bufp, table_size, 5);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}